

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O2

void sellobj(obj *obj,xchar x,xchar y)

{
  int iVar1;
  obj *poVar2;
  bool bVar3;
  level *lev;
  boolean bVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  monst *mtmp;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  char *pcVar13;
  long lVar14;
  char *pcVar15;
  char *pcVar16;
  int iVar17;
  char *pcVar18;
  char *pcVar19;
  char *pcVar20;
  long delta;
  long lVar21;
  char *pcVar22;
  bool bVar23;
  long local_168;
  char qbuf [256];
  
  lev = level;
  poVar2 = obj->cobj;
  cVar5 = obj->oclass;
  pcVar8 = in_rooms(level,x,y,0x12);
  mtmp = shop_keeper(lev,*pcVar8);
  if (mtmp == (monst *)0x0) {
    return;
  }
  iVar6 = inhishop(mtmp);
  if (iVar6 == 0) {
    return;
  }
  bVar4 = costly_spot(x,y);
  if (bVar4 == '\0') {
    return;
  }
  if (u.ushops[0] == '\0') {
    return;
  }
  if (((obj->field_0x4a & 4) != 0 && cVar5 != '\f') && poVar2 == (obj *)0x0) {
    sub_one_frombill(obj,mtmp);
    return;
  }
  if (poVar2 == (obj *)0x0) {
    bVar23 = false;
    lVar9 = 0;
    local_168 = 0;
  }
  else {
    local_168 = contained_cost(obj,mtmp,0,'\x01','\0');
    lVar9 = contained_gold(obj);
    bVar23 = 0 < lVar9;
  }
  bVar4 = saleable(mtmp,obj);
  bVar3 = true;
  lVar14 = local_168;
  if (cVar5 == '\f') {
    lVar10 = 0;
  }
  else {
    if (bVar4 == '\0' || (obj->field_0x4a & 4) != 0) {
      lVar10 = 0;
    }
    else {
      lVar10 = set_cost(obj,mtmp);
      lVar14 = lVar10 + local_168;
    }
    if (bVar23 == false) {
      if ((lVar14 + lVar9 == 0) || (sell_how == 2)) {
        bVar23 = (*(uint *)&obj->field_0x4a & 4) == 0;
        if (poVar2 == (obj *)0x0 || !bVar23) {
          if (poVar2 == (obj *)0x0) {
            *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a | 8;
            goto LAB_0022f15d;
          }
        }
        else {
          iVar6 = count_unpaid(obj->cobj);
          bVar23 = iVar6 == 0;
        }
        dropped_container(obj,mtmp,'\0');
        uVar7 = *(uint *)&obj->field_0x4a;
        if ((uVar7 & 4) == 0) {
          uVar7 = uVar7 | 8;
          *(uint *)&obj->field_0x4a = uVar7;
        }
        if (((uVar7 & 4) != 0) || (iVar6 = count_unpaid(obj->cobj), iVar6 != 0)) {
          subfrombill(obj,mtmp);
        }
LAB_0022f15d:
        if (!bVar23) {
          return;
        }
        if (sell_how == 2) {
          return;
        }
        pcVar8 = Monnam(mtmp);
        pline("%s seems uninterested.",pcVar8);
        return;
      }
      bVar3 = false;
    }
  }
  rouse_shk(mtmp,'\x01');
  if ((mtmp->field_0x62 & 0x40) == 0) {
    pline("Thank you, scum!");
LAB_0022efb9:
    subfrombill(obj,mtmp);
    return;
  }
  iVar6._0_1_ = mtmp[0x1b].mtame;
  iVar6._1_1_ = mtmp[0x1b].m_ap_type;
  iVar6._2_1_ = mtmp[0x1b].mfrozen;
  iVar6._3_1_ = mtmp[0x1b].mblinded;
  if (iVar6 != 0) {
    if (cVar5 == '\f') {
      lVar14 = (long)obj->quan;
    }
    else {
      lVar14 = lVar14 + (ulong)bVar23;
    }
    mtmp[0x1b].mtame = '\0';
    mtmp[0x1b].m_ap_type = '\0';
    mtmp[0x1b].mfrozen = '\0';
    mtmp[0x1b].mblinded = '\0';
    if (lVar14 != 0) {
      verbalize("Thank you for your contribution to restock this recently plundered shop.");
    }
    goto LAB_0022efb9;
  }
  if (bVar3) {
    if (bVar23 == false) {
      lVar9 = (long)obj->quan;
    }
    iVar6 = *(int *)&mtmp[0x1b].field_0x60;
    lVar21 = lVar9 - iVar6;
    if (lVar21 == 0 || lVar9 < iVar6) {
      iVar1 = *(int *)&mtmp[0x1b].mfleetim;
      if ((long)iVar1 != 0) {
        iVar17 = 0;
        if (lVar9 <= iVar1) {
          iVar17 = iVar1 - (int)lVar9;
        }
        mtmp[0x1b].mfleetim = (char)iVar17;
        mtmp[0x1b].wormno = (char)((uint)iVar17 >> 8);
        mtmp[0x1b].weapon_check = (char)((uint)iVar17 >> 0x10);
        mtmp[0x1b].field_0x67 = (char)((uint)iVar17 >> 0x18);
      }
      iVar6 = iVar6 - (int)lVar9;
      *(int *)&mtmp[0x1b].field_0x60 = iVar6;
      pcVar8 = "partially ";
      if (iVar6 == 0) {
        pcVar8 = "";
      }
      pline("Your debt is %spaid off.",pcVar8);
    }
    else {
      mtmp[0x1b].mappearance = mtmp[0x1b].mappearance + (int)lVar21;
      if (iVar6 != 0) {
        *(undefined8 *)&mtmp[0x1b].field_0x60 = 0;
        pline("Your debt is paid off.");
      }
      pcVar8 = currency(lVar21);
      pcVar15 = "is";
      if (1 < lVar21) {
        pcVar15 = "are";
      }
      pline("%ld %s %s added to your credit.",lVar21,pcVar8,pcVar15);
    }
    if ((lVar14 == 0) || (sell_how == 2)) {
      if (cVar5 == '\f') {
        return;
      }
      if (poVar2 != (obj *)0x0) {
        dropped_container(obj,mtmp,'\0');
      }
      if ((*(uint *)&obj->field_0x4a & 4) == 0) {
        *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a | 8;
      }
      goto LAB_0022efb9;
    }
  }
  if ((((((bVar4 == '\0') && (poVar2 == (obj *)0x0 || local_168 < 1)) ||
        (*(short *)((long)&mtmp[0x1b].misc_worn_check + 2) == 200)) ||
       ((cVar5 = obj->oclass, cVar5 == '\x0f' || (cVar5 == '\x10')))) ||
      ((lVar14 == 0 || ((cVar5 == '\a' && (obj->oeaten != 0)))))) ||
     (((ushort)(obj->otyp - 0xe5U) < 2 &&
      (lVar9 = (long)objects[(ushort)obj->otyp].oc_cost * 0x14,
      lVar9 - obj->age != 0 && obj->age <= lVar9)))) {
    pcVar8 = Monnam(mtmp);
    pcVar15 = "";
    if (bVar23 != false) {
      pcVar15 = " in the rest";
    }
    pline("%s seems uninterested%s.",pcVar8,pcVar15);
    if (poVar2 != (obj *)0x0) {
      dropped_container(obj,mtmp,'\0');
    }
    obj->field_0x4a = obj->field_0x4a | 8;
    return;
  }
  lVar9 = money_cnt(mtmp->minvent);
  if (lVar9 == 0) {
    lVar9 = (ulong)(lVar14 < 2) + (lVar14 * 9) / 10;
    if ((sell_how == 0) || ((auto_credit & 1) != 0)) {
      sell_response = 'y';
      goto LAB_0022f4a4;
    }
    if (sell_response != 'n') {
      pcVar8 = Monnam(mtmp);
      pline("%s cannot pay you at present.",pcVar8);
      pcVar8 = currency(lVar9);
      pcVar15 = doname(obj);
      sprintf(qbuf,"Will you accept %ld %s in credit for %s?",lVar9,pcVar8,pcVar15);
      cVar5 = yn_function(qbuf,"ynaq",'y');
      if (cVar5 == 'y') {
LAB_0022f4a4:
        pcVar8 = "You traded %s for %ld zorkmid%s in %scredit.";
        if (sell_how == 0) {
          pcVar8 = "You relinquish %s and acquire %ld zorkmid%s in %scredit.";
        }
        pcVar15 = "";
        if (0 < (int)mtmp[0x1b].mappearance) {
          pcVar15 = "additional ";
        }
        shk_names_obj(mtmp,obj,pcVar8,lVar9,pcVar15);
        mtmp[0x1b].mappearance = mtmp[0x1b].mappearance + (int)lVar9;
        goto LAB_0022f4eb;
      }
      if (cVar5 != 'q') {
        if (cVar5 != 'a') goto LAB_0022f47a;
        auto_credit = 1;
        goto LAB_0022f4a4;
      }
      goto LAB_0022f473;
    }
  }
  else {
    lVar21 = money_cnt(mtmp->minvent);
    lVar9 = lVar21;
    if (lVar14 < lVar21) {
      lVar9 = lVar14;
    }
    if (sell_response == '\0') {
      lVar11 = contained_cost(obj,mtmp,0,'\0','\0');
      lVar12 = contained_cost(obj,mtmp,0,'\0','\x01');
      pcVar8 = Monnam(mtmp);
      pcVar15 = " only";
      if (lVar14 <= lVar21) {
        pcVar15 = "";
      }
      pcVar20 = "s";
      if (lVar9 == 1) {
        pcVar20 = "";
      }
      pcVar16 = "the";
      if ((obj->field_0x4a & 4) == 0) {
        pcVar16 = "your";
      }
      pcVar13 = cxname(obj);
      bVar23 = lVar11 == lVar12;
      pcVar19 = " your items in";
      if (bVar23) {
        pcVar19 = " the contents of";
      }
      pcVar18 = "them";
      if (bVar23) {
        pcVar18 = "it";
      }
      pcVar22 = "You sold some items inside %s for %ld gold pieces%s.%s";
      if (bVar23) {
        pcVar22 = "You sold %s for %ld gold piece%s.%s";
      }
      if (lVar10 != 0 || local_168 == 0) {
        pcVar19 = "";
        pcVar18 = "it";
      }
      if (obj->quan != 1) {
        pcVar18 = "them";
      }
      sprintf(qbuf,"%s offers%s %ld gold piece%s for%s %s %s.  Sell %s?",pcVar8,pcVar15,lVar9,
              pcVar20,pcVar19,pcVar16,pcVar13,pcVar18);
      if (sell_response != '\0') goto LAB_0022f450;
      cVar5 = yn_function(qbuf,"ynaq",'y');
      uVar7 = (uint)cVar5;
    }
    else {
      qbuf[0] = '\0';
      pcVar22 = "You sold %s for %ld gold piece%s.%s";
LAB_0022f450:
      uVar7 = (uint)(byte)sell_response;
    }
    if (uVar7 == 0x61) {
      sell_response = 'y';
LAB_0022f502:
      if (poVar2 != (obj *)0x0) {
        dropped_container(obj,mtmp,'\x01');
      }
      if ((char)((*(uint *)&obj->field_0x4a & 4) >> 2) == '\0' && bVar4 == '\0') {
        *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a | 8;
      }
      subfrombill(obj,mtmp);
      pay(-lVar9,mtmp);
      if (local_168 == 0) {
        pcVar22 = "You sold %s for %ld gold piece%s.%s";
      }
      if (lVar10 != 0) {
        pcVar22 = "You sold %s for %ld gold piece%s.%s";
      }
      pcVar8 = "You relinquish %s and receive %ld gold piece%s in compensation.%s";
      if (sell_how != 0) {
        pcVar8 = pcVar22;
      }
      shk_names_obj(mtmp,obj,pcVar8,lVar9,"");
      return;
    }
    if (uVar7 != 0x6e) {
      if (uVar7 == 0x79) goto LAB_0022f502;
      if (uVar7 != 0x71) {
        warning("invalid sell response");
        return;
      }
LAB_0022f473:
      sell_response = 'n';
    }
  }
LAB_0022f47a:
  if (poVar2 != (obj *)0x0) {
    dropped_container(obj,mtmp,'\0');
  }
  if ((*(uint *)&obj->field_0x4a & 4) == 0) {
    *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a | 8;
  }
LAB_0022f4eb:
  subfrombill(obj,mtmp);
  return;
}

Assistant:

void sellobj(struct obj *obj, xchar x, xchar y)
{
	struct monst *shkp;
	struct eshk *eshkp;
	long ltmp = 0L, cltmp = 0L, gltmp = 0L, offer;
	boolean saleitem, cgold = FALSE, container = Has_contents(obj);
	boolean isgold = (obj->oclass == COIN_CLASS);
	boolean only_partially_your_contents = FALSE;

	if (!(shkp = shop_keeper(level, *in_rooms(level, x, y, SHOPBASE))) ||
	   !inhishop(shkp)) return;
	if (!costly_spot(x, y))	return;
	if (!*u.ushops) return;

	if (obj->unpaid && !container && !isgold) {
	    sub_one_frombill(obj, shkp);
	    return;
	}
	if (container) {
		/* find the price of content before subfrombill */
		cltmp += contained_cost(obj, shkp, cltmp, TRUE, FALSE);
		/* find the value of contained gold */
		gltmp += contained_gold(obj);
		cgold = (gltmp > 0L);
	}

	saleitem = saleable(shkp, obj);
	if (!isgold && !obj->unpaid && saleitem)
	    ltmp = set_cost(obj, shkp);

	offer = ltmp + cltmp;

	/* get one case out of the way: nothing to sell, and no gold */
	if (!(isgold || cgold) &&
	   ((offer + gltmp) == 0L || sell_how == SELL_DONTSELL)) {
		boolean unpaid = (obj->unpaid ||
				  (container && count_unpaid(obj->cobj)));

		if (container) {
			dropped_container(obj, shkp, FALSE);
			if (!obj->unpaid)
			    obj->no_charge = 1;
			if (obj->unpaid || count_unpaid(obj->cobj))
			    subfrombill(obj, shkp);
		} else obj->no_charge = 1;

		if (!unpaid && (sell_how != SELL_DONTSELL))
		    pline("%s seems uninterested.", Monnam(shkp));
		return;
	}

	/* you dropped something of your own - probably want to sell it */
	rouse_shk(shkp, TRUE);	/* wake up sleeping or paralyzed shk */
	eshkp = ESHK(shkp);

	if (ANGRY(shkp)) { /* they become shop-objects, no pay */
		pline("Thank you, scum!");
		subfrombill(obj, shkp);
		return;
	}

	if (eshkp->robbed) {  /* shkp is not angry? */
		if (isgold) offer = obj->quan;
		else if (cgold) offer += cgold;
		if ((eshkp->robbed -= offer < 0L))
			eshkp->robbed = 0L;
		if (offer) verbalize(
  "Thank you for your contribution to restock this recently plundered shop.");
		subfrombill(obj, shkp);
		return;
	}

	if (isgold || cgold) {
		if (!cgold) gltmp = obj->quan;

		if (eshkp->debit >= gltmp) {
		    if (eshkp->loan) { /* you carry shop's gold */
			 if (eshkp->loan >= gltmp)
			     eshkp->loan -= gltmp;
			 else eshkp->loan = 0L;
		    }
		    eshkp->debit -= gltmp;
		    pline("Your debt is %spaid off.",
				eshkp->debit ? "partially " : "");
		} else {
		    long delta = gltmp - eshkp->debit;

		    eshkp->credit += delta;
		    if (eshkp->debit) {
			eshkp->debit = 0L;
			eshkp->loan = 0L;
			pline("Your debt is paid off.");
		    }
		    pline("%ld %s %s added to your credit.",
				delta, currency(delta), delta > 1L ? "are" : "is");
		}
		if (offer && sell_how != SELL_DONTSELL) {
		    goto move_on;
		} else {
		    if (!isgold) {
			if (container)
			    dropped_container(obj, shkp, FALSE);
			if (!obj->unpaid) obj->no_charge = 1;
			subfrombill(obj, shkp);
		    }
		    return;
		}
	}
move_on:
	if ((!saleitem && !(container && cltmp > 0L))
	   || eshkp->billct == BILLSZ
	   || obj->oclass == BALL_CLASS
	   || obj->oclass == CHAIN_CLASS || offer == 0L
	   || (obj->oclass == FOOD_CLASS && obj->oeaten)
	   || (Is_candle(obj) &&
		   obj->age < 20L * (long)objects[obj->otyp].oc_cost)) {
		pline("%s seems uninterested%s.", Monnam(shkp),
			cgold ? " in the rest" : "");
		if (container)
		    dropped_container(obj, shkp, FALSE);
		obj->no_charge = 1;
		return;
	}
        
	if (!money_cnt(shkp->minvent)) {
		char c, qbuf[BUFSZ];
		long tmpcr = ((offer * 9L) / 10L) + (offer <= 1L);

		if (sell_how == SELL_NORMAL || auto_credit) {
		    c = sell_response = 'y';
		} else if (sell_response != 'n') {
		    pline("%s cannot pay you at present.", Monnam(shkp));
		    sprintf(qbuf,
			    "Will you accept %ld %s in credit for %s?",
			    tmpcr, currency(tmpcr), doname(obj));
		    /* won't accept 'a' response here */
		    /* KLY - 3/2000 yes, we will, it's a damn nuisance
                       to have to constantly hit 'y' to sell for credit */
		    c = ynaq(qbuf);
		    if (c == 'a') {
			c = 'y';
			auto_credit = TRUE;
		    }
		} else		/* previously specified "quit" */
		    c = 'n';

		if (c == 'y') {
		    shk_names_obj(shkp, obj, (sell_how != SELL_NORMAL) ?
			    "You traded %s for %ld zorkmid%s in %scredit." :
			"You relinquish %s and acquire %ld zorkmid%s in %scredit.",
			    tmpcr,
			    (eshkp->credit > 0L) ? "additional " : "");
		    eshkp->credit += tmpcr;
		    subfrombill(obj, shkp);
		} else {
		    if (c == 'q') sell_response = 'n';
		    if (container)
			dropped_container(obj, shkp, FALSE);
		    if (!obj->unpaid) obj->no_charge = 1;
		    subfrombill(obj, shkp);
		}
	} else {
		char qbuf[BUFSZ];
                long shkmoney = money_cnt(shkp->minvent);
		boolean short_funds = (offer > shkmoney);
		if (short_funds) offer = shkmoney;
		if (!sell_response) {
		    only_partially_your_contents =
			(contained_cost(obj, shkp, 0L, FALSE, FALSE) !=
			 contained_cost(obj, shkp, 0L, FALSE, TRUE));
		    sprintf(qbuf,
			 "%s offers%s %ld gold piece%s for%s %s %s.  Sell %s?",
			    Monnam(shkp), short_funds ? " only" : "",
			    offer, plur(offer),
			    (!ltmp && cltmp && only_partially_your_contents) ?
			     " your items in" : (!ltmp && cltmp) ? " the contents of" : "",
			    obj->unpaid ? "the" : "your", cxname(obj),
			    (obj->quan == 1L &&
			    !(!ltmp && cltmp && only_partially_your_contents)) ?
			    "it" : "them");
		} else  qbuf[0] = '\0';		/* just to pacify lint */

		switch (sell_response ? sell_response : ynaq(qbuf)) {
		 case 'q':  sell_response = 'n';
		 case 'n':  if (container)
				dropped_container(obj, shkp, FALSE);
			    if (!obj->unpaid) obj->no_charge = 1;
			    subfrombill(obj, shkp);
			    break;
		 case 'a':  sell_response = 'y';
		 case 'y':  if (container)
				dropped_container(obj, shkp, TRUE);
			    if (!obj->unpaid && !saleitem) obj->no_charge = 1;
			    subfrombill(obj, shkp);
			    pay(-offer, shkp);
			    shk_names_obj(shkp, obj, (sell_how != SELL_NORMAL) ?
				    (!ltmp && cltmp && only_partially_your_contents) ?
			    	    "You sold some items inside %s for %ld gold pieces%s.%s" :
				    "You sold %s for %ld gold piece%s.%s" :
	       "You relinquish %s and receive %ld gold piece%s in compensation.%s",
				    offer, "");
			    break;
		 default:   warning("invalid sell response");
		}
	}
}